

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O1

void __thiscall OSTEI_Writer::WriteAccumulation(OSTEI_Writer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar2;
  _Base_ptr p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QAMSet topq;
  string local_168;
  string local_148;
  string local_128;
  undefined8 local_108;
  undefined8 uStack_100;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_f8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  _Base_ptr p_Stack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined8 local_68;
  _Base_ptr p_Stack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_f8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"////////////////////////////////////\n",0x25);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"// Accumulate contracted integrals\n",0x23);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"////////////////////////////////////\n",0x25);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"if(lastoffset == 0)\n",0x14);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    paVar1 = &local_168.field_2;
    p_Var3 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_98 = *(undefined8 *)(p_Var3 + 1);
      p_Stack_90 = p_Var3[1]._M_parent;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      local_108 = local_98;
      uStack_100 = p_Stack_90;
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                          indent6_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"contract_all(",0xd);
      auVar4._0_4_ = (int)local_108 + 2;
      auVar4._4_4_ = local_108._4_4_ + 2;
      auVar4._8_4_ = (int)uStack_100 + 2;
      auVar4._12_4_ = uStack_100._4_4_ + 2;
      auVar6._4_4_ = local_108._4_4_ + 1;
      auVar6._12_4_ = uStack_100._4_4_ + 1;
      auVar6._0_4_ = auVar6._4_4_;
      auVar6._8_4_ = auVar6._12_4_;
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          (~((int)uStack_100 >> 0x1f) &
                          (uint)((auVar4._8_8_ & 0xffffffff) * (ulong)((int)uStack_100 + 1)) >> 1) *
                          (~((int)local_108 >> 0x1f) &
                          (uint)(auVar4._0_4_ * ((int)local_108 + 1)) >> 1) *
                          (~(local_108._4_4_ >> 0x1f) & (uint)(auVar6._4_4_ * auVar4._4_4_) >> 1) *
                          (~(uStack_100._4_4_ >> 0x1f) &
                          (uint)((auVar6._8_8_ & 0xffffffff) * (ulong)auVar4._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      local_168._M_string_length = 4;
      local_168.field_2._M_allocated_capacity._0_5_ = 0x4d495250;
      local_168._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_148,(QAM *)(p_Var3 + 1),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_148._M_dataplus._M_p,local_148._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      local_168.field_2._M_allocated_capacity = 0x5254505f4d495250;
      local_168._M_string_length = 8;
      local_168.field_2._M_local_buf[8] = '\0';
      local_168._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_128,(QAM *)(p_Var3 + 1),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_f8._M_impl.super__Rb_tree_header);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"else\n",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{\n",2);
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    paVar1 = &local_168.field_2;
    p_Var3 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_68 = *(undefined8 *)(p_Var3 + 1);
      p_Stack_60 = p_Var3[1]._M_parent;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      local_108 = local_68;
      uStack_100 = p_Stack_60;
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                          indent6_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"contract(",9);
      auVar5._0_4_ = (int)local_108 + 2;
      auVar5._4_4_ = local_108._4_4_ + 2;
      auVar5._8_4_ = (int)uStack_100 + 2;
      auVar5._12_4_ = uStack_100._4_4_ + 2;
      auVar7._4_4_ = local_108._4_4_ + 1;
      auVar7._12_4_ = uStack_100._4_4_ + 1;
      auVar7._0_4_ = auVar7._4_4_;
      auVar7._8_4_ = auVar7._12_4_;
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          (~((int)uStack_100 >> 0x1f) &
                          (uint)((auVar5._8_8_ & 0xffffffff) * (ulong)((int)uStack_100 + 1)) >> 1) *
                          (~((int)local_108 >> 0x1f) &
                          (uint)(auVar5._0_4_ * ((int)local_108 + 1)) >> 1) *
                          (~(local_108._4_4_ >> 0x1f) & (uint)(auVar7._4_4_ * auVar5._4_4_) >> 1) *
                          (~(uStack_100._4_4_ >> 0x1f) &
                          (uint)((auVar7._8_8_ & 0xffffffff) * (ulong)auVar5._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", shelloffsets, ",0x10);
      local_168._M_string_length = 4;
      local_168.field_2._M_allocated_capacity._0_5_ = 0x4d495250;
      local_168._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_148,(QAM *)(p_Var3 + 1),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_148._M_dataplus._M_p,local_148._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      local_168.field_2._M_allocated_capacity = 0x5254505f4d495250;
      local_168._M_string_length = 8;
      local_168.field_2._M_local_buf[8] = '\0';
      local_168._M_dataplus._M_p = (pointer)paVar1;
      ArrVarName(&local_128,(QAM *)(p_Var3 + 1),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");\n",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_f8._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    p_Var3 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((this->super_OSTEI_Writer_Base).os_,indent6_abi_cxx11_._M_dataplus._M_p,
                          indent6_abi_cxx11_._M_string_length);
      local_168.field_2._M_allocated_capacity = 0x5254505f4d495250;
      local_168._M_string_length = 8;
      local_168.field_2._M_local_buf[8] = '\0';
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      ArrVarName(&local_148,(QAM *)(p_Var3 + 1),&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_148._M_dataplus._M_p,local_148._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," += lastoffset*",0xf);
      local_c8 = *(undefined8 *)(((QAM *)(p_Var3 + 1))->qam)._M_elems;
      uStack_c0 = p_Var3[1]._M_parent;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      auVar8._0_4_ = (int)local_c8 + 2;
      auVar8._4_4_ = local_c8._4_4_ + 2;
      auVar8._8_4_ = (int)uStack_c0 + 2;
      auVar8._12_4_ = uStack_c0._4_4_ + 2;
      auVar9._4_4_ = local_c8._4_4_ + 1;
      auVar9._12_4_ = uStack_c0._4_4_ + 1;
      auVar9._0_4_ = auVar9._4_4_;
      auVar9._8_4_ = auVar9._12_4_;
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          (~((int)uStack_c0 >> 0x1f) &
                          (uint)((auVar8._8_8_ & 0xffffffff) * (ulong)((int)uStack_c0 + 1)) >> 1) *
                          (~((int)local_c8 >> 0x1f) &
                          (uint)(auVar8._0_4_ * ((int)local_c8 + 1)) >> 1) *
                          (~(local_c8._4_4_ >> 0x1f) & (uint)(auVar9._4_4_ * auVar8._4_4_) >> 1) *
                          (~(uStack_c0._4_4_ >> 0x1f) &
                          (uint)((auVar9._8_8_ & 0xffffffff) * (ulong)auVar8._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n",2);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &local_f8._M_impl.super__Rb_tree_header);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_f8);
  return;
}

Assistant:

void OSTEI_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract_all(" << ncart << ", " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        os_ << indent6 << "contract(" << ncart << ", shelloffsets, " << PrimVarName(it) << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}